

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall hdc::Driver::callCppCompiler(Driver *this)

{
  ostream *poVar1;
  stringstream s;
  char *local_1b0 [4];
  stringstream local_190 [16];
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  poVar1 = std::operator<<(local_180,"g++ gen.cpp -fpermissive -o ");
  std::operator<<(poVar1,(string *)&this->outputName);
  std::__cxx11::stringbuf::str();
  system(local_1b0[0]);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

void Driver::callCppCompiler() {
    std::stringstream s;

    s << "g++ gen.cpp -fpermissive -o " << outputName;
    system(s.str().c_str());
}